

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statemachine.cpp
# Opt level: O2

callback_t *
multi_purpose_string_state
          (callback_t *__return_storage_ptr__,MetaConfiguration *conf,ifstream *f,int *error)

{
  char t;
  bool bVar1;
  QDebug *pQVar2;
  code *pcVar3;
  string *psVar4;
  string *s;
  initializer_list<char> __l;
  initializer_list<char> __l_00;
  allocator_type local_72;
  char local_71;
  _Vector_base<char,_std::allocator<char>_> local_70;
  string local_58;
  vector<char,_std::allocator<char>_> delimiters;
  
  local_58._M_dataplus._M_p._0_4_ = 0x203d5b7b;
  local_58._M_dataplus._M_p._4_1_ = 10;
  __l._M_len = 5;
  __l._M_array = (iterator)&local_58;
  std::vector<char,_std::allocator<char>_>::vector(&delimiters,__l,(allocator_type *)&local_70);
  read_untill_delimiters_abi_cxx11_(&local_58,f,&delimiters);
  psVar4 = &local_58;
  std::__cxx11::string::append((string *)&(anonymous_namespace)::global_string_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_58);
  anon_unknown.dwarf_1f3b3::trim
            ((anon_unknown_dwarf_1f3b3 *)&(anonymous_namespace)::global_string_abi_cxx11_,psVar4);
  parser();
  if ((parser()::category[0x10] & 1) != 0) {
    parser();
    local_58._M_dataplus._M_p._0_4_ = 2;
    local_58._4_8_ = 0;
    local_58._12_8_ = 0;
    local_58.field_2._M_allocated_capacity._4_4_ = 0;
    local_58.field_2._8_8_ = parser()::category._8_8_;
    QMessageLogger::debug();
    pQVar2 = QDebug::operator<<((QDebug *)&local_70,"string found: ");
    pQVar2 = operator<<(pQVar2,(string *)&(anonymous_namespace)::global_string_abi_cxx11_);
    pQVar2 = QDebug::operator<<(pQVar2," next character: ");
    t = std::istream::peek();
    QDebug::operator<<(pQVar2,t);
    QDebug::~QDebug((QDebug *)&local_70);
  }
  if ((conf->top_level_class).super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &(anonymous_namespace)::global_string_abi_cxx11_,"namespace");
    if (!bVar1) goto LAB_00104ea8;
    local_71 = '{';
    __l_00._M_len = 1;
    __l_00._M_array = &local_71;
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)&local_70,__l_00,&local_72);
    read_untill_delimiters_abi_cxx11_(&local_58,f,(vector<char,_std::allocator<char>_> *)&local_70);
    s = &conf->conf_namespace;
    psVar4 = &local_58;
    std::__cxx11::string::operator=((string *)s,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_70);
    anon_unknown.dwarf_1f3b3::trim((anon_unknown_dwarf_1f3b3 *)s,psVar4);
    std::istream::ignore();
    DAT_00113318 = 0;
    *(anonymous_namespace)::global_string_abi_cxx11_ = 0;
    parser();
    if ((parser()::category[0x10] & 1) != 0) {
      parser();
      local_58._M_dataplus._M_p._0_4_ = 2;
      local_58._4_8_ = 0;
      local_58._12_8_ = 0;
      local_58.field_2._M_allocated_capacity._4_4_ = 0;
      local_58.field_2._8_8_ = parser()::category._8_8_;
      QMessageLogger::debug();
      pQVar2 = QDebug::operator<<((QDebug *)&local_70,"Setting a namespace");
      operator<<(pQVar2,s);
      QDebug::~QDebug((QDebug *)&local_70);
    }
    *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
    pcVar3 = initial_state;
  }
  else {
LAB_00104ea8:
    if ((anonymous_namespace)::current_property != 0) {
      (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
      __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
      *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
      goto LAB_00104ef6;
    }
    if ((anonymous_namespace)::current_class == 0) {
      pcVar3 = initial_state;
    }
    else {
      pcVar3 = class_state;
    }
    *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  }
  *(code **)&(__return_storage_ptr__->super__Function_base)._M_functor = pcVar3;
  __return_storage_ptr__->_M_invoker =
       std::
       _Function_handler<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&),_std::function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>_(*)(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>
       ::_M_invoke;
  (__return_storage_ptr__->super__Function_base)._M_manager =
       std::
       _Function_handler<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&),_std::function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>_(*)(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>
       ::_M_manager;
LAB_00104ef6:
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&delimiters.super__Vector_base<char,_std::allocator<char>_>);
  return __return_storage_ptr__;
}

Assistant:

callback_t multi_purpose_string_state(MetaConfiguration &conf, std::ifstream &f,
                                      int &error) {
  std::vector<char> delimiters = {'{', '[', '=', ' ', '\n'};
  global_string += read_untill_delimiters(f, delimiters);
  trim(global_string);

  qCDebug(parser) << "string found: " << global_string
                  << " next character: " << (char)f.peek();
  if (!conf.top_level_class && global_string == "namespace") {
    conf.conf_namespace = read_untill_delimiters(f, {'{'});
    trim(conf.conf_namespace);

    f.ignore();
    global_string.clear();
    qCDebug(parser) << "Setting a namespace" << conf.conf_namespace;
    return initial_state;
  }

  return current_property ? nullptr // create a state for them.
                          : current_class ? class_state : initial_state;
}